

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFCompileUnit.cpp
# Opt level: O0

void __thiscall
llvm::DWARFCompileUnit::dump(DWARFCompileUnit *this,raw_ostream *OS,DIDumpOptions DumpOpts)

{
  byte bVar1;
  uint8_t uVar2;
  bool bVar3;
  uint16_t uVar4;
  raw_ostream *prVar5;
  unsigned_long *Vals;
  Optional<unsigned_long> OVar6;
  undefined1 local_128 [8];
  DWARFDie CUDie;
  format_object<unsigned_long> local_110;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_f8;
  undefined1 local_f0;
  format_object<unsigned_long> local_e8;
  uint8_t local_c9;
  format_object<unsigned_char> local_c8;
  uint64_t local_b0;
  format_object<unsigned_long> local_a8;
  DWARFAbbreviationDeclarationSet *local_90;
  DWARFAbbreviationDeclarationSet *Abbreviations;
  uint16_t local_72;
  format_object<unsigned_short> local_70;
  uint64_t local_58;
  format_object<unsigned_long> local_50;
  uint64_t local_38;
  format_object<unsigned_long> local_30;
  raw_ostream *local_18;
  raw_ostream *OS_local;
  DWARFCompileUnit *this_local;
  
  local_18 = OS;
  OS_local = (raw_ostream *)this;
  local_38 = DWARFUnit::getOffset(&this->super_DWARFUnit);
  format<unsigned_long>(&local_30,"0x%08lx",&local_38);
  prVar5 = raw_ostream::operator<<(OS,&local_30.super_format_object_base);
  prVar5 = raw_ostream::operator<<(prVar5,": Compile Unit:");
  prVar5 = raw_ostream::operator<<(prVar5," length = ");
  local_58 = DWARFUnit::getLength(&this->super_DWARFUnit);
  format<unsigned_long>(&local_50,"0x%08lx",&local_58);
  prVar5 = raw_ostream::operator<<(prVar5,&local_50.super_format_object_base);
  prVar5 = raw_ostream::operator<<(prVar5," version = ");
  local_72 = DWARFUnit::getVersion(&this->super_DWARFUnit);
  format<unsigned_short>(&local_70,"0x%04x",&local_72);
  raw_ostream::operator<<(prVar5,&local_70.super_format_object_base);
  uVar4 = DWARFUnit::getVersion(&this->super_DWARFUnit);
  if (4 < uVar4) {
    prVar5 = raw_ostream::operator<<(local_18," unit_type = ");
    bVar1 = DWARFUnit::getUnitType(&this->super_DWARFUnit);
    _Abbreviations = dwarf::UnitTypeString((uint)bVar1);
    raw_ostream::operator<<(prVar5,_Abbreviations);
  }
  local_90 = DWARFUnit::getAbbreviations(&this->super_DWARFUnit);
  if (local_90 != (DWARFAbbreviationDeclarationSet *)0x0) {
    prVar5 = raw_ostream::operator<<(local_18," abbr_offset = ");
    local_b0 = DWARFAbbreviationDeclarationSet::getOffset(local_90);
    format<unsigned_long>(&local_a8,"0x%04lx",&local_b0);
    raw_ostream::operator<<(prVar5,&local_a8.super_format_object_base);
  }
  prVar5 = raw_ostream::operator<<(local_18," addr_size = ");
  local_c9 = DWARFUnit::getAddressByteSize(&this->super_DWARFUnit);
  format<unsigned_char>(&local_c8,"0x%02x",&local_c9);
  raw_ostream::operator<<(prVar5,&local_c8.super_format_object_base);
  uVar4 = DWARFUnit::getVersion(&this->super_DWARFUnit);
  if (4 < uVar4) {
    uVar2 = DWARFUnit::getUnitType(&this->super_DWARFUnit);
    if (uVar2 != '\x01') {
      prVar5 = raw_ostream::operator<<(local_18," DWO_id = ");
      OVar6 = DWARFUnit::getDWOId(&this->super_DWARFUnit);
      local_f8 = OVar6.Storage.field_0;
      local_f0 = OVar6.Storage.hasVal;
      Vals = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_f8);
      format<unsigned_long>(&local_e8,"0x%016lx",Vals);
      raw_ostream::operator<<(prVar5,&local_e8.super_format_object_base);
    }
  }
  prVar5 = raw_ostream::operator<<(local_18," (next unit at ");
  CUDie.Die = (DWARFDebugInfoEntry *)DWARFUnit::getNextUnitOffset(&this->super_DWARFUnit);
  format<unsigned_long>(&local_110,"0x%08lx",(unsigned_long *)&CUDie.Die);
  prVar5 = raw_ostream::operator<<(prVar5,&local_110.super_format_object_base);
  raw_ostream::operator<<(prVar5,")\n");
  _local_128 = DWARFUnit::getUnitDIE(&this->super_DWARFUnit,false);
  bVar3 = DWARFDie::operator_cast_to_bool((DWARFDie *)local_128);
  if (bVar3) {
    DWARFDie::dump((DWARFDie *)local_128,local_18,0,DumpOpts);
  }
  else {
    raw_ostream::operator<<(local_18,"<compile unit can\'t be parsed!>\n\n");
  }
  return;
}

Assistant:

void DWARFCompileUnit::dump(raw_ostream &OS, DIDumpOptions DumpOpts) {
  OS << format("0x%08" PRIx64, getOffset()) << ": Compile Unit:"
     << " length = " << format("0x%08" PRIx64, getLength())
     << " version = " << format("0x%04x", getVersion());
  if (getVersion() >= 5)
    OS << " unit_type = " << dwarf::UnitTypeString(getUnitType());
  if (auto* Abbreviations = getAbbreviations()) { // XXX BINARYEN
    OS << " abbr_offset = "
       << format("0x%04" PRIx64, Abbreviations->getOffset());
  }
  OS << " addr_size = " << format("0x%02x", getAddressByteSize());
  if (getVersion() >= 5 && getUnitType() != dwarf::DW_UT_compile)
    OS << " DWO_id = " << format("0x%016" PRIx64, *getDWOId());
  OS << " (next unit at " << format("0x%08" PRIx64, getNextUnitOffset())
     << ")\n";

  if (DWARFDie CUDie = getUnitDIE(false))
    CUDie.dump(OS, 0, DumpOpts);
  else
    OS << "<compile unit can't be parsed!>\n\n";
}